

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# path_del.c
# Opt level: O0

int mpt_path_del(mpt_path *path)

{
  byte bVar1;
  long lVar2;
  char *pcVar3;
  bool bVar4;
  uint local_4c;
  mpt_array local_40;
  mpt_array arr;
  size_t part;
  size_t pos;
  size_t len;
  uint8_t *data;
  mpt_path *path_local;
  
  pos = path->len;
  if ((mpt_buffer *)pos == (mpt_buffer *)0x0) {
    return -0x10;
  }
  pcVar3 = path->base;
  if ((path->flags & 0x80) == 0) {
    len = (size_t)(pcVar3 + (path->off - 2) + (long)&((mpt_buffer *)pos)->_vptr);
    arr._buf = (mpt_buffer *)0x0;
    while( true ) {
      pos = pos - 1;
      bVar4 = false;
      if (pos != 0) {
        bVar4 = (uint)*(byte *)len != (int)path->sep;
      }
      if (!bVar4) break;
      arr._buf = (mpt_buffer *)((long)&(arr._buf)->_vptr + 1);
      len = len - 1;
    }
  }
  else {
    if ((pos < (mpt_buffer *)0x2) ||
       (arr._buf = (mpt_buffer *)
                   (ulong)(byte)(pcVar3 + (path->off - 2))[(long)&((mpt_buffer *)pos)->_vptr],
       pos <= arr._buf)) {
      return -2;
    }
    pos = pos - (long)((long)&(arr._buf)->_vptr + 2);
    lVar2 = pos + path->off;
    if (lVar2 == 0) {
      bVar1 = path->first;
    }
    else {
      bVar1 = pcVar3[lVar2 + -1];
    }
    local_4c = (uint)bVar1;
    if (arr._buf != (mpt_buffer *)(long)(int)local_4c) {
      return -4;
    }
  }
  if ((path->flags & 0x40) != 0) {
    local_40._buf = (mpt_buffer *)(path->base + -0x20);
    if (*(ulong *)(path->base + -8) < pos) {
      return -2;
    }
    pcVar3 = (char *)mpt_array_slice(&local_40,0,pos);
    if (pcVar3 == (char *)0x0) {
      return -4;
    }
    path->base = pcVar3;
    (local_40._buf)->_used = pos;
  }
  path->len = pos;
  if (pos == 0) {
    path->first = '\0';
  }
  path->flags = path->flags & 0xfe;
  return (int)arr._buf;
}

Assistant:

extern int mpt_path_del(MPT_STRUCT(path) *path)
{
	uint8_t *data;
	size_t len, pos, part;
	
	if (!(len = path->len)) {
		return MPT_ERROR(MissingData);
	}
	data = (uint8_t *) path->base;
	pos  = len + path->off;
	
	/* binary linked size separation format */
	if (path->flags & MPT_PATHFLAG(SepBinary)) {
		/* total length error */
		if (len < 2 || len <= (part = data[pos-2])) {
			return MPT_ERROR(BadValue);
		}
		len -= part + 2;
		pos  = len + path->off;
		
		/* forward/backward inconsistency */
		if (part != (pos ? data[pos-1] : path->first)) {
			return MPT_ERROR(BadOperation);
		}
	}
	else {
		/* start on character before assign */
		data += (pos - 2);
		part  = 0;
		
		/* find last separator */
		while (--len && (*(data) != path->sep)) {
			++part; --data;
		}
	}
	if (path->flags & MPT_PATHFLAG(HasArray)) {
		MPT_STRUCT(array) arr;
		arr._buf = (void *) path->base;
		pos = (--arr._buf)->_used;
		if (len > pos) {
			return MPT_ERROR(BadValue);
		}
		pos = len;
		if (!(data = mpt_array_slice(&arr, 0, pos))) {
			return MPT_ERROR(BadOperation);
		}
		path->base = (char *) data;
		arr._buf->_used = pos;
	}
	
	if (!(path->len = len)) {
		path->first = 0;
	}
	path->flags &= ~MPT_PATHFLAG(KeepPost);
	
	return part;
}